

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libnbt.cpp
# Opt level: O0

ssize_t __thiscall
libnbt::NBTTagString::read(NBTTagString *this,int __fd,void *__buf,size_t __nbytes)

{
  ssize_t sVar1;
  undefined4 in_register_00000034;
  libnbt local_40 [38];
  int16_t local_1a;
  istream *piStack_18;
  int16_t length;
  istream *in_local;
  NBTTagString *this_local;
  
  piStack_18 = (istream *)CONCAT44(in_register_00000034,__fd);
  local_1a = 0;
  in_local = (istream *)this;
  readBytes(piStack_18,(char *)&local_1a,'\x02');
  readString_abi_cxx11_(local_40,piStack_18,local_1a);
  std::__cxx11::string::operator=
            ((string *)
             &(this->
              super_NBTTagData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )._data,(string *)local_40);
  sVar1 = std::__cxx11::string::~string((string *)local_40);
  return sVar1;
}

Assistant:

void NBTTagString::read(std::istream &in) {
        int16_t length = 0;
        readBytes(in, (char *) &length, 2);
        _data = readString(in, length);
    }